

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.cpp
# Opt level: O0

void __thiscall glu::VarTokenizer::advance(VarTokenizer *this)

{
  bool bVar1;
  TestError *this_00;
  VarTokenizer *this_local;
  
  this->m_tokenStart = this->m_tokenLen + this->m_tokenStart;
  this->m_token = TOKEN_LAST;
  this->m_tokenLen = 1;
  if (this->m_str[this->m_tokenStart] == '[') {
    this->m_token = TOKEN_LEFT_BRACKET;
  }
  else if (this->m_str[this->m_tokenStart] == ']') {
    this->m_token = TOKEN_RIGHT_BRACKET;
  }
  else if (this->m_str[this->m_tokenStart] == '\0') {
    this->m_token = TOKEN_END;
  }
  else if (this->m_str[this->m_tokenStart] == '.') {
    this->m_token = TOKEN_PERIOD;
  }
  else {
    bVar1 = isNum(this->m_str[this->m_tokenStart]);
    if (bVar1) {
      this->m_token = TOKEN_NUMBER;
      while (bVar1 = isNum(this->m_str[this->m_tokenStart + this->m_tokenLen]), bVar1) {
        this->m_tokenLen = this->m_tokenLen + 1;
      }
    }
    else {
      bVar1 = isIdentifierChar(this->m_str[this->m_tokenStart]);
      if (!bVar1) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Unexpected character",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                   ,0x50);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      this->m_token = TOKEN_IDENTIFIER;
      while (bVar1 = isIdentifierChar(this->m_str[this->m_tokenStart + this->m_tokenLen]), bVar1) {
        this->m_tokenLen = this->m_tokenLen + 1;
      }
    }
  }
  return;
}

Assistant:

void VarTokenizer::advance (void)
{
	DE_ASSERT(m_token != TOKEN_END);

	m_tokenStart	+= m_tokenLen;
	m_token			 = TOKEN_LAST;
	m_tokenLen		 = 1;

	if (m_str[m_tokenStart] == '[')
		m_token = TOKEN_LEFT_BRACKET;
	else if (m_str[m_tokenStart] == ']')
		m_token = TOKEN_RIGHT_BRACKET;
	else if (m_str[m_tokenStart] == 0)
		m_token = TOKEN_END;
	else if (m_str[m_tokenStart] == '.')
		m_token = TOKEN_PERIOD;
	else if (isNum(m_str[m_tokenStart]))
	{
		m_token = TOKEN_NUMBER;
		while (isNum(m_str[m_tokenStart+m_tokenLen]))
			m_tokenLen += 1;
	}
	else if (isIdentifierChar(m_str[m_tokenStart]))
	{
		m_token = TOKEN_IDENTIFIER;
		while (isIdentifierChar(m_str[m_tokenStart+m_tokenLen]))
			m_tokenLen += 1;
	}
	else
		TCU_FAIL("Unexpected character");
}